

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O1

void __thiscall
mtmd_context::mtmd_context
          (mtmd_context *this,char *mmproj_fname,llama_model *text_model,
          mtmd_context_params *ctx_params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pfVar3;
  bool bVar4;
  int iVar5;
  llama_token lVar6;
  clip_ctx *ctx;
  runtime_error *this_00;
  undefined8 uVar7;
  clip_context_params ctx_params_00;
  string local_48;
  
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->print_timings = ctx_params->print_timings;
  this->n_threads = ctx_params->n_threads;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->image_marker,ctx_params->image_marker,(allocator<char> *)&local_48);
  this->slice_tmpl = MTMD_SLICE_TMPL_NONE;
  this->tok_ov_img_start = -1;
  this->tok_ov_img_end = -1;
  this->tok_slices_start = -1;
  this->tok_slices_end = -1;
  this->tok_slices_end = -1;
  this->tok_sli_img_start = -1;
  this->tok_sli_img_end = -1;
  this->tok_row_end = -1;
  ctx_params_00 =
       (clip_context_params)((ulong)ctx_params->verbosity << 0x20 | (ulong)ctx_params->use_gpu);
  ctx = clip_init(mmproj_fname,ctx_params_00);
  this->ctx_clip = ctx;
  if (ctx == (clip_ctx *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_(&local_48,(char *)ctx_params_00,mmproj_fname);
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->text_model = text_model;
  bVar4 = clip_is_qwen2vl(ctx);
  if (!bVar4) {
    iVar5 = clip_is_minicpmv(this->ctx_clip);
    if (iVar5 == 2) {
      this->slice_tmpl = MTMD_SLICE_TMPL_MINICPMV_2_5;
      paVar1 = &local_48.field_2;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<image>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_ov_img_start = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"</image>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_ov_img_end = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<slice>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_slices_start = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"</slice>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_slices_end = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      this->tok_sli_img_start = this->tok_ov_img_start;
      this->tok_sli_img_end = this->tok_ov_img_end;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\n","");
      lVar6 = lookup_token(this,&local_48);
    }
    else {
      if (1 < iVar5 - 3U) {
        if (iVar5 == 0) {
          return;
        }
        goto LAB_00123b9c;
      }
      this->slice_tmpl = MTMD_SLICE_TMPL_MINICPMV_2_6;
      paVar1 = &local_48.field_2;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<image>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_ov_img_start = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"</image>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_ov_img_end = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<slice>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_sli_img_start = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"</slice>","");
      lVar6 = lookup_token(this,&local_48);
      this->tok_sli_img_end = lVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\n","");
      lVar6 = lookup_token(this,&local_48);
    }
    this->tok_row_end = lVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
             ,0x3d,"GGML_ASSERT(%s) failed",
             "!clip_is_qwen2vl(ctx_clip) && \"Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead\""
            );
LAB_00123b9c:
  uVar7 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                     ,0x57,"GGML_ASSERT(%s) failed","false && \"unsupported minicpmv version\"");
  if ((llama_model *)local_48._M_dataplus._M_p != text_model) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->image_marker)._M_dataplus._M_p;
  paVar1 = &(this->image_marker).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pfVar3 = (this->image_embd_v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)(this->image_embd_v).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

mtmd_context(const char * mmproj_fname,
                   const llama_model * text_model,
                   const mtmd_context_params & ctx_params) :
        print_timings(ctx_params.print_timings),
        n_threads    (ctx_params.n_threads),
        image_marker (ctx_params.image_marker)
    {
        clip_context_params ctx_clip_params;
        ctx_clip_params.use_gpu   = ctx_params.use_gpu;
        ctx_clip_params.verbosity = ctx_params.verbosity;
        ctx_clip = clip_init(mmproj_fname, ctx_clip_params);
        if (!ctx_clip) {
            throw std::runtime_error(string_format("Failed to load CLIP model from %s\n", mmproj_fname));
        }
        this->text_model = text_model;

        GGML_ASSERT(!clip_is_qwen2vl(ctx_clip) && "Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead");

        int minicpmv_version = clip_is_minicpmv(ctx_clip);
        if (minicpmv_version == 2) {
            // minicpmv 2.5 format:
            // <image> (overview) </image><slice><image> (slice) </image><image> (slice) </image>\n ... </slice>
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_5;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_slices_start  = lookup_token("<slice>");
            tok_slices_end    = lookup_token("</slice>");
            tok_sli_img_start = tok_ov_img_start;
            tok_sli_img_end   = tok_ov_img_end;
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version == 3 || minicpmv_version == 4) {
            // minicpmv 2.6 format:
            // <image> (overview) </image><slice> (slice) </slice><slice> (slice) </slice>\n ...
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_6;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_sli_img_start = lookup_token("<slice>");
            tok_sli_img_end   = lookup_token("</slice>");
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version != 0) {
            GGML_ASSERT(false && "unsupported minicpmv version");
        }
    }